

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::Structure::Member,_8UL>::reserve
          (ArrayWithPreallocation<soul::Structure::Member,_8UL> *this,size_t minSize)

{
  Category *pCVar1;
  Category *pCVar2;
  Member *pMVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 uVar6;
  Member *pMVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar10 = this->numAllocated;
  if (uVar10 < minSize) {
    uVar8 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar8 != 0) {
      pMVar7 = (Member *)operator_new__(uVar8 << 6);
      if (this->numActive != 0) {
        lVar9 = 0x28;
        uVar10 = 0;
        do {
          pCVar1 = &(pMVar7->type).category + lVar9;
          pMVar3 = this->items;
          pCVar2 = &(pMVar3->type).category + lVar9;
          *(undefined4 *)((long)pMVar7 + lVar9 + -0x28) =
               *(undefined4 *)((long)pMVar3 + lVar9 + -0x28);
          *(undefined4 *)((long)pMVar7 + lVar9 + -0x24) =
               *(undefined4 *)((long)pMVar3 + lVar9 + -0x24);
          *(undefined8 *)((long)pMVar7 + lVar9 + -0x20) =
               *(undefined8 *)((long)pMVar3 + lVar9 + -0x20);
          *(undefined8 *)((long)pMVar7 + lVar9 + -0x18) =
               *(undefined8 *)((long)pMVar3 + lVar9 + -0x18);
          *(undefined8 *)((long)pMVar3 + lVar9 + -0x18) = 0;
          *(Category **)((long)pMVar7 + lVar9 + -0x10) = pCVar1;
          puVar4 = *(undefined8 **)((long)pMVar3 + lVar9 + -0x10);
          if (pCVar2 == (Category *)puVar4) {
            uVar6 = *(undefined8 *)(pCVar2 + 8);
            *(undefined8 *)pCVar1 = *(undefined8 *)pCVar2;
            *(undefined8 *)(pCVar1 + 8) = uVar6;
          }
          else {
            *(undefined8 **)((long)pMVar7 + lVar9 + -0x10) = puVar4;
            *(undefined8 *)(&(pMVar7->type).category + lVar9) = *(undefined8 *)pCVar2;
          }
          *(undefined8 *)((long)pMVar7 + lVar9 + -8) = *(undefined8 *)((long)pMVar3 + lVar9 + -8);
          *(Category **)((long)pMVar3 + lVar9 + -0x10) = pCVar2;
          *(undefined8 *)((long)pMVar3 + lVar9 + -8) = 0;
          (&(pMVar3->type).category)[lVar9] = invalid;
          *(undefined8 *)((long)&(pMVar7->type).structure.object + lVar9) =
               *(undefined8 *)((long)&(pMVar3->type).structure.object + lVar9);
          pMVar3 = this->items;
          pCVar1 = &(pMVar3->type).category + lVar9;
          plVar5 = *(long **)((long)pMVar3 + lVar9 + -0x10);
          if (pCVar1 != (Category *)plVar5) {
            operator_delete(plVar5,*(long *)pCVar1 + 1);
          }
          RefCountedPtr<soul::Structure>::decIfNotNull
                    (*(Structure **)((long)pMVar3 + lVar9 + -0x18));
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x40;
        } while (uVar10 < this->numActive);
        uVar10 = this->numAllocated;
      }
      if ((8 < uVar10) && (this->items != (Member *)0x0)) {
        operator_delete__(this->items);
      }
      this->items = pMVar7;
    }
    this->numAllocated = uVar8;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }